

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaDup.c
# Opt level: O3

Gia_Man_t * Gia_ManDupOrderDfs(Gia_Man_t *p)

{
  int iVar1;
  char *pcVar2;
  Gia_Obj_t *pGVar3;
  Gia_Obj_t *pGVar4;
  Gia_Man_t *pNew;
  size_t sVar5;
  char *pcVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *pVVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  Gia_ManFillValue(p);
  pNew = Gia_ManStart(p->nObjs);
  pcVar2 = p->pName;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  pNew->pName = pcVar6;
  pcVar2 = p->pSpec;
  if (pcVar2 == (char *)0x0) {
    pcVar6 = (char *)0x0;
  }
  else {
    sVar5 = strlen(pcVar2);
    pcVar6 = (char *)malloc(sVar5 + 1);
    strcpy(pcVar6,pcVar2);
  }
  pNew->pSpec = pcVar6;
  p->pObjs->Value = 0;
  pVVar8 = p->vCos;
  if (0 < pVVar8->nSize) {
    lVar12 = 0;
    do {
      iVar1 = pVVar8->pArray[lVar12];
      if (((long)iVar1 < 0) || (p->nObjs <= iVar1)) goto LAB_001d6b64;
      if (p->pObjs == (Gia_Obj_t *)0x0) break;
      Gia_ManDupOrderDfs_rec(pNew,p,p->pObjs + iVar1);
      lVar12 = lVar12 + 1;
      pVVar8 = p->vCos;
    } while (lVar12 < pVVar8->nSize);
  }
  pVVar8 = p->vCis;
  uVar9 = pVVar8->nSize;
  uVar10 = (ulong)uVar9;
  if (0 < (int)uVar9) {
    lVar12 = 0;
    do {
      uVar9 = (uint)uVar10;
      lVar11 = (long)pVVar8->pArray[lVar12];
      if ((lVar11 < 0) || (p->nObjs <= pVVar8->pArray[lVar12])) {
LAB_001d6b64:
        __assert_fail("v >= 0 && v < p->nObjs",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                      ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
      }
      pGVar3 = p->pObjs;
      if (pGVar3 == (Gia_Obj_t *)0x0) break;
      if (pGVar3[lVar11].Value == 0xffffffff) {
        pGVar7 = Gia_ManAppendObj(pNew);
        uVar10 = *(ulong *)pGVar7;
        *(ulong *)pGVar7 = uVar10 | 0x9fffffff;
        *(ulong *)pGVar7 =
             uVar10 & 0xe0000000ffffffff | 0x9fffffff |
             (ulong)(pNew->vCis->nSize & 0x1fffffff) << 0x20;
        pGVar4 = pNew->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) {
LAB_001d6b83:
          __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                        ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
        }
        Vec_IntPush(pNew->vCis,(int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * -0x55555555);
        pGVar4 = pNew->pObjs;
        if ((pGVar7 < pGVar4) || (pGVar4 + pNew->nObjs <= pGVar7)) goto LAB_001d6b83;
        pGVar3[lVar11].Value = (int)((ulong)((long)pGVar7 - (long)pGVar4) >> 2) * 0x55555556;
        pVVar8 = p->vCis;
      }
      lVar12 = lVar12 + 1;
      uVar9 = pVVar8->nSize;
      uVar10 = (ulong)(int)uVar9;
    } while (lVar12 < (long)uVar10);
  }
  if (pNew->vCis->nSize == uVar9) {
    Gia_ManDupRemapCis(pNew,p);
    Gia_ManDupRemapEquiv(pNew,p);
    Gia_ManSetRegNum(pNew,p->nRegs);
    return pNew;
  }
  __assert_fail("Gia_ManCiNum(pNew) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaDup.c"
                ,0xd9,"Gia_Man_t *Gia_ManDupOrderDfs(Gia_Man_t *)");
}

Assistant:

Gia_Man_t * Gia_ManDupOrderDfs( Gia_Man_t * p )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj;
    int i;
    Gia_ManFillValue( p );
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManForEachCo( p, pObj, i )
        Gia_ManDupOrderDfs_rec( pNew, p, pObj );
    Gia_ManForEachCi( p, pObj, i )
        if ( !~pObj->Value )
            pObj->Value = Gia_ManAppendCi(pNew);
    assert( Gia_ManCiNum(pNew) == Gia_ManCiNum(p) );
    Gia_ManDupRemapCis( pNew, p );
    Gia_ManDupRemapEquiv( pNew, p );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}